

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O0

ENUM__image_format_hint_channels_enum
COLLADASaxFWL15::toEnum_ENUM__image_format_hint_channels_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__image_format_hint_channels_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  ENUM__image_format_hint_channels_enum EVar1;
  _func_unsigned_long_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *in_RDI;
  
  EVar1 = GeneratedSaxParser::Utils::
          toEnum<COLLADASaxFWL15::ENUM__image_format_hint_channels_enum,_unsigned_long,_(COLLADASaxFWL15::ENUM__image_format_hint_channels_enum)6>
                    ((ParserChar **)bufferEnd,failed,(bool *)enumMap,
                     (pair<unsigned_long,_COLLADASaxFWL15::ENUM__image_format_hint_channels_enum> *)
                     baseConversionFunc,in_RDI);
  return EVar1;
}

Assistant:

ENUM__image_format_hint_channels_enum toEnum_ENUM__image_format_hint_channels_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__image_format_hint_channels_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__image_format_hint_channels_enum, StringHash, ENUM__image_format_hint_channels_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}